

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-gpio.c
# Opt level: O0

void print_help(void)

{
  fprintf(_stdout,"list              List pins\n");
  fprintf(_stdout,"set pin level     Set pin to level (0/1)\n");
  fprintf(_stdout,"setraw pin level  Set pin to level (0/1) via mmap (if available)\n");
  fprintf(_stdout,"get pin           Get pin level\n");
  fprintf(_stdout,"getraw pin        Get pin level via mmap (if available)\n");
  fprintf(_stdout,"monitor pin       Monitor pin level changes\n");
  fprintf(_stdout,"version           Get mraa version and board name\n");
  return;
}

Assistant:

void
print_help()
{
    fprintf(stdout, "list              List pins\n");
    fprintf(stdout, "set pin level     Set pin to level (0/1)\n");
    fprintf(stdout, "setraw pin level  Set pin to level (0/1) via mmap (if available)\n");
    fprintf(stdout, "get pin           Get pin level\n");
    fprintf(stdout, "getraw pin        Get pin level via mmap (if available)\n");
    fprintf(stdout, "monitor pin       Monitor pin level changes\n");
    fprintf(stdout, "version           Get mraa version and board name\n");
}